

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

void Gia_ManEquivToChoices_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pObjNew;
  Gia_Obj_t *pReprNew;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  if (pObj->Value == 0xffffffff) {
    iVar1 = Gia_ObjId(p,pObj);
    pGVar7 = Gia_ObjReprObj(p,iVar1);
    if (pGVar7 == (Gia_Obj_t *)0x0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                      ,0x6ce,"void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                     );
      }
      pGVar7 = Gia_ObjFanin0(pObj);
      Gia_ManEquivToChoices_rec(pNew,p,pGVar7);
      pGVar7 = Gia_ObjFanin1(pObj);
      Gia_ManEquivToChoices_rec(pNew,p,pGVar7);
      iVar1 = Gia_ObjFanin0Copy(pObj);
      iVar5 = Gia_ObjFanin1Copy(pObj);
      uVar4 = Gia_ManHashAnd(pNew,iVar1,iVar5);
      pObj->Value = uVar4;
    }
    else {
      iVar1 = Gia_ObjIsConst0(pGVar7);
      if (iVar1 == 0) {
        Gia_ManEquivToChoices_rec(pNew,p,pGVar7);
        iVar1 = Gia_ObjIsAnd(pObj);
        if (iVar1 == 0) {
          __assert_fail("Gia_ObjIsAnd(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                        ,0x6af,
                        "void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
        }
        pGVar8 = Gia_ObjFanin0(pObj);
        Gia_ManEquivToChoices_rec(pNew,p,pGVar8);
        pGVar8 = Gia_ObjFanin1(pObj);
        Gia_ManEquivToChoices_rec(pNew,p,pGVar8);
        iVar1 = Gia_ObjFanin0Copy(pObj);
        iVar5 = Gia_ObjFanin1Copy(pObj);
        uVar4 = Gia_ManHashAnd(pNew,iVar1,iVar5);
        pObj->Value = uVar4;
        iVar1 = Abc_LitRegular(pObj->Value);
        iVar5 = Abc_LitRegular(pGVar7->Value);
        if (iVar1 == iVar5) {
          uVar4 = pObj->Value;
          uVar2 = pGVar7->Value;
          uVar3 = Gia_ObjPhaseReal(pGVar7);
          uVar6 = Gia_ObjPhaseReal(pObj);
          uVar2 = Abc_LitNotCond(uVar2,uVar3 ^ uVar6);
          if (uVar4 != uVar2) {
            __assert_fail("(int)pObj->Value == Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) )"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                          ,0x6b5,
                          "void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
          }
        }
        else if (pGVar7->Value <= pObj->Value) {
          if (pObj->Value <= pGVar7->Value) {
            __assert_fail("pRepr->Value < pObj->Value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                          ,0x6ba,
                          "void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar1 = Abc_Lit2Var(pGVar7->Value);
          pGVar8 = Gia_ManObj(pNew,iVar1);
          iVar1 = Abc_Lit2Var(pObj->Value);
          pGVar9 = Gia_ManObj(pNew,iVar1);
          iVar1 = Gia_ObjId(pNew,pGVar9);
          pGVar10 = Gia_ObjReprObj(pNew,iVar1);
          if (pGVar10 == (Gia_Obj_t *)0x0) {
            iVar1 = Gia_ObjCheckTfi(pNew,pGVar8,pGVar9);
            if (iVar1 == 0) {
              iVar1 = Gia_ObjId(pNew,pGVar9);
              iVar1 = Gia_ObjNext(pNew,iVar1);
              if (iVar1 != 0) {
                __assert_fail("Gia_ObjNext(pNew, Gia_ObjId(pNew, pObjNew)) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaEquiv.c"
                              ,0x6c7,
                              "void Gia_ManEquivToChoices_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)"
                             );
              }
              iVar1 = Gia_ObjId(pNew,pGVar9);
              iVar5 = Gia_ObjId(pNew,pGVar8);
              Gia_ObjSetRepr(pNew,iVar1,iVar5);
              Gia_ManAddNextEntry_rec(pNew,pGVar8,pGVar9);
            }
            uVar4 = pGVar7->Value;
            uVar2 = Gia_ObjPhaseReal(pGVar7);
            uVar3 = Gia_ObjPhaseReal(pObj);
            uVar4 = Abc_LitNotCond(uVar4,uVar2 ^ uVar3);
            pObj->Value = uVar4;
          }
          else {
            iVar1 = Gia_ObjId(pNew,pGVar9);
            pGVar9 = Gia_ObjReprObj(pNew,iVar1);
            if (pGVar9 == pGVar8) {
              uVar4 = pGVar7->Value;
              uVar2 = Gia_ObjPhaseReal(pGVar7);
              uVar3 = Gia_ObjPhaseReal(pObj);
              uVar4 = Abc_LitNotCond(uVar4,uVar2 ^ uVar3);
              pObj->Value = uVar4;
            }
          }
        }
      }
      else {
        uVar4 = pGVar7->Value;
        uVar2 = Gia_ObjPhaseReal(pGVar7);
        uVar3 = Gia_ObjPhaseReal(pObj);
        uVar4 = Abc_LitNotCond(uVar4,uVar2 ^ uVar3);
        pObj->Value = uVar4;
      }
    }
  }
  return;
}

Assistant:

void Gia_ManEquivToChoices_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Gia_Obj_t * pRepr, * pReprNew, * pObjNew;
    if ( ~pObj->Value )
        return;
    if ( (pRepr = Gia_ObjReprObj(p, Gia_ObjId(p, pObj))) )
    {
        if ( Gia_ObjIsConst0(pRepr) )
        {
            pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
            return;
        }
        Gia_ManEquivToChoices_rec( pNew, p, pRepr );
        assert( Gia_ObjIsAnd(pObj) );
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
        Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( Abc_LitRegular(pObj->Value) == Abc_LitRegular(pRepr->Value) )
        {
            assert( (int)pObj->Value == Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) ) );
            return;
        }
        if ( pRepr->Value > pObj->Value ) // should never happen with high resource limit
            return;
        assert( pRepr->Value < pObj->Value );
        pReprNew = Gia_ManObj( pNew, Abc_Lit2Var(pRepr->Value) );
        pObjNew  = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) )
        {
//            assert( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) == pReprNew );
            if ( Gia_ObjReprObj( pNew, Gia_ObjId(pNew, pObjNew) ) != pReprNew )
                return;
            pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
            return;
        }
        if ( !Gia_ObjCheckTfi( pNew, pReprNew, pObjNew ) )
        {
            assert( Gia_ObjNext(pNew, Gia_ObjId(pNew, pObjNew)) == 0 );
            Gia_ObjSetRepr( pNew, Gia_ObjId(pNew, pObjNew), Gia_ObjId(pNew, pReprNew) );
            Gia_ManAddNextEntry_rec( pNew, pReprNew, pObjNew );
        }
        pObj->Value = Abc_LitNotCond( pRepr->Value, Gia_ObjPhaseReal(pRepr) ^ Gia_ObjPhaseReal(pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManEquivToChoices_rec( pNew, p, Gia_ObjFanin1(pObj) );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}